

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bheap.c
# Opt level: O0

void sx_bheap_push_max(sx_bheap *bh,int key,void *user)

{
  undefined8 uVar1;
  void *pvVar2;
  undefined8 uVar3;
  void *pvVar4;
  sx_bheap_item *psVar5;
  code *pcVar6;
  int iVar7;
  int local_48;
  sx_bheap_item parent;
  sx_bheap_item cur;
  int parent_idx;
  int index;
  void *user_local;
  int key_local;
  sx_bheap *bh_local;
  
  if (bh->capacity <= bh->count) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/bheap.c",
                      0x79,"BinaryHeap\'s capacity exceeded");
    pcVar6 = (code *)swi(3);
    (*pcVar6)();
    return;
  }
  cur.user._4_4_ = bh->count;
  bh->items[cur.user._4_4_].key = key;
  bh->items[cur.user._4_4_].user = user;
  while (0 < cur.user._4_4_) {
    iVar7 = cur.user._4_4_ + -1 >> 1;
    uVar1 = *(undefined8 *)(bh->items + cur.user._4_4_);
    pvVar2 = bh->items[cur.user._4_4_].user;
    uVar3 = *(undefined8 *)(bh->items + iVar7);
    pvVar4 = bh->items[iVar7].user;
    parent.user._0_4_ = (int)uVar1;
    local_48 = (int)uVar3;
    if ((int)parent.user <= local_48) break;
    psVar5 = bh->items;
    *(undefined8 *)(psVar5 + cur.user._4_4_) = uVar3;
    psVar5[cur.user._4_4_].user = pvVar4;
    psVar5 = bh->items;
    *(undefined8 *)(psVar5 + iVar7) = uVar1;
    psVar5[iVar7].user = pvVar2;
    cur.user._4_4_ = iVar7;
  }
  bh->count = bh->count + 1;
  return;
}

Assistant:

void sx_bheap_push_max(sx_bheap* bh, int key, void* user)
{
    sx_assertf(bh->count < bh->capacity, "BinaryHeap's capacity exceeded");

    // Put the value at the bottom the tree and traverse up
    int index = bh->count;
    bh->items[index].key = key;
    bh->items[index].user = user;

    while (index > 0) {
        int parent_idx = (index - 1) >> 1;
        sx_bheap_item cur = bh->items[index];
        sx_bheap_item parent = bh->items[parent_idx];

        if (cur.key > parent.key) {
            bh->items[index] = parent;
            bh->items[parent_idx] = cur;
        } else {
            break;
        }

        index = parent_idx;
    }
    ++bh->count;
}